

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Array * __thiscall notch::core::Net::output(Net *this,Array *inputs)

{
  int iVar1;
  __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2
  ;
  element_type *peVar3;
  undefined4 extraout_var;
  size_type sVar4;
  undefined4 extraout_var_00;
  uint local_24;
  Array *pAStack_20;
  uint i;
  Array *out;
  Array *inputs_local;
  Net *this_local;
  
  selfCheck(this);
  p_Var2 = (__shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
              ::operator[](&this->layers,0);
  peVar3 = std::
           __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  iVar1 = (*peVar3->_vptr_ABackpropLayer[0xc])(peVar3,inputs);
  pAStack_20 = (Array *)CONCAT44(extraout_var,iVar1);
  local_24 = 1;
  while( true ) {
    sVar4 = std::
            vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
            ::size(&this->layers);
    if (sVar4 <= local_24) break;
    p_Var2 = (__shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                ::operator[](&this->layers,(ulong)local_24);
    peVar3 = std::
             __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    iVar1 = (*peVar3->_vptr_ABackpropLayer[0xc])(peVar3,pAStack_20);
    pAStack_20 = (Array *)CONCAT44(extraout_var_00,iVar1);
    local_24 = local_24 + 1;
  }
  return pAStack_20;
}

Assistant:

const Array &output(const Array &inputs) {
        selfCheck();
        const Array *out = &(layers[0]->output(inputs));
        for (auto i = 1u; i < layers.size(); ++i) {
            out = &(layers[i]->output(*out));
        }
        return *out;
    }